

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::MapTextureSubresource
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pTexture,Uint32 MipLevel,
          Uint32 ArraySlice,MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,
          MappedTextureSubresource *MappedData)

{
  Uint32 *pUVar1;
  int iVar2;
  undefined4 extraout_var;
  string local_50;
  
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>(&local_50,(char (*) [26])0x6602d1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"MapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x754);
    std::__cxx11::string::~string((string *)&local_50);
  }
  iVar2 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  ValidateMapTextureParams
            ((TextureDesc *)CONCAT44(extraout_var,iVar2),MipLevel,ArraySlice,MapType,(uint)MapFlags,
             pMapRegion);
  pUVar1 = &(this->m_Stats).CommandCounters.MapTextureSubresource;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::MapTextureSubresource(
    ITexture*                 pTexture,
    Uint32                    MipLevel,
    Uint32                    ArraySlice,
    MAP_TYPE                  MapType,
    MAP_FLAGS                 MapFlags,
    const Box*                pMapRegion,
    MappedTextureSubresource& MappedData)
{
    DEV_CHECK_ERR(pTexture, "pTexture must not be null");
    ValidateMapTextureParams(pTexture->GetDesc(), MipLevel, ArraySlice, MapType, MapFlags, pMapRegion);
    ++m_Stats.CommandCounters.MapTextureSubresource;
}